

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall Generator::addEnums(Generator *this)

{
  FILE *pFVar1;
  uint uVar2;
  int iVar3;
  EnumDef *pEVar4;
  EnumDef *pEVar5;
  long lVar6;
  char *pcVar7;
  EnumDef *e;
  EnumDef *s;
  QByteArray *val;
  char *pcVar8;
  QByteArray *s_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  char *separator;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  s = (this->cdef->super_BaseDef).enumList.d.ptr;
  pEVar4 = s + (this->cdef->super_BaseDef).enumList.d.size;
  for (; s != pEVar4; s = s + 1) {
    pEVar5 = (EnumDef *)&s->enumName;
    if ((s->enumName).d.ptr == (char *)0x0) {
      pEVar5 = s;
    }
    pcVar8 = "flag";
    if (((s->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
         super_QFlagsStorage<QtMocConstants::EnumFlags>.i & 1) == 0) {
      pcVar8 = "enum";
    }
    pcVar7 = (s->name).d.ptr;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = &QByteArray::_empty;
    }
    pFVar1 = (FILE *)this->out;
    uVar2 = stridx(this,&s->name);
    iVar3 = stridx(this,&pEVar5->name);
    fprintf(pFVar1,"        // %s \'%s\'\n        QtMocHelpers::EnumData<%s>(%d, %d,",pcVar8,pcVar7,
            pcVar7,(ulong)uVar2,iVar3);
    uVar2 = (s->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
            super_QFlagsStorage<QtMocConstants::EnumFlags>.i;
    if (uVar2 == 0) {
      fwrite(" QMC::EnumFlags{}",0x11,1,(FILE *)this->out);
    }
    else {
      separator = "";
      local_58.ptr = (char *)&separator;
      local_58.d = (Data *)this;
      if ((uVar2 & 1) != 0) {
        addEnums::anon_class_16_2_ccb47752::operator()
                  ((anon_class_16_2_ccb47752 *)&local_58,"EnumIsFlag");
        uVar2 = (s->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
                super_QFlagsStorage<QtMocConstants::EnumFlags>.i;
      }
      if ((uVar2 & 2) != 0) {
        addEnums::anon_class_16_2_ccb47752::operator()
                  ((anon_class_16_2_ccb47752 *)&local_58,"EnumIsScoped");
      }
    }
    if ((s->values).d.size == 0) {
      fwrite("),\n",3,1,(FILE *)this->out);
    }
    else {
      fwrite(").add({\n",8,1,(FILE *)this->out);
      pEVar5 = (EnumDef *)&s->enumName;
      if ((s->enumName).d.ptr == (char *)0x0) {
        pEVar5 = s;
      }
      local_58.d = (pEVar5->name).d.d;
      local_58.ptr = (pEVar5->name).d.ptr;
      local_58.size = (pEVar5->name).d.size;
      if ((Generator *)local_58.d != (Generator *)0x0) {
        LOCK();
        *(int *)&((Generator *)local_58.d)->parser = *(int *)&((Generator *)local_58.d)->parser + 1;
        UNLOCK();
      }
      s_00 = (s->values).d.ptr;
      for (lVar6 = (s->values).d.size * 0x18; pFVar1 = (FILE *)this->out, lVar6 != 0;
          lVar6 = lVar6 + -0x18) {
        uVar2 = stridx(this,s_00);
        pcVar8 = local_58.ptr;
        if ((char **)local_58.ptr == (char **)0x0) {
          pcVar8 = &QByteArray::_empty;
        }
        pcVar7 = (s_00->d).ptr;
        if (pcVar7 == (char *)0x0) {
          pcVar7 = &QByteArray::_empty;
        }
        fprintf(pFVar1,"            { %4d, %s::%s },\n",(ulong)uVar2,pcVar8,pcVar7);
        s_00 = s_00 + 1;
      }
      fwrite("        }),\n",0xc,1,pFVar1);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Generator::addEnums()
{
    for (const EnumDef &e : std::as_const(cdef->enumList)) {
        const QByteArray &typeName = e.enumName.isNull() ? e.name : e.enumName;
        fprintf(out, "        // %s '%s'\n"
                     "        QtMocHelpers::EnumData<%s>(%d, %d,",
                e.flags & EnumIsFlag ? "flag" : "enum", e.name.constData(),
                e.name.constData(), stridx(e.name), stridx(typeName));

        if (e.flags) {
            const char *separator = "";
            auto addFlag = [this, &separator](const char *text) {
                fprintf(out, "%s QMC::%s", separator, text);
                separator = " |";
            };
            if (e.flags & EnumIsFlag)
                addFlag("EnumIsFlag");
            if (e.flags & EnumIsScoped)
                addFlag("EnumIsScoped");
        } else {
            fprintf(out, " QMC::EnumFlags{}");
        }

        if (e.values.isEmpty()) {
            fprintf(out, "),\n");
            continue;
        }

        // add the enumerations
        fprintf(out, ").add({\n");
        QByteArray prefix = (e.enumName.isNull() ? e.name : e.enumName);
        for (const QByteArray &val : e.values) {
            fprintf(out, "            { %4d, %s::%s },\n", stridx(val),
                    prefix.constData(), val.constData());
        }

        fprintf(out, "        }),\n");
    }
}